

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_set.h
# Opt level: O0

variable_set * __thiscall
merlin::variable_set::operator-
          (variable_set *__return_storage_ptr__,variable_set *this,variable_set *B)

{
  ulong uVar1;
  value_type vVar2;
  size_t sVar3;
  reference pvVar4;
  const_reference pvVar5;
  bool bVar6;
  size_type local_40;
  size_t k;
  size_t j;
  size_t i;
  variable_set *B_local;
  variable_set *this_local;
  variable_set *dest;
  
  sVar3 = size(this);
  variable_set(__return_storage_ptr__,sVar3);
  j = 0;
  k = 0;
  local_40 = 0;
  while( true ) {
    sVar3 = size(this);
    bVar6 = false;
    if (j < sVar3) {
      sVar3 = size(B);
      bVar6 = k < sVar3;
    }
    if (!bVar6) break;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&this->m_v,j);
    uVar1 = *pvVar5;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&B->m_v,k);
    if (uVar1 < *pvVar5) {
      vVar2 = this->m_d[j];
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&__return_storage_ptr__->m_dlocal,local_40);
      *pvVar4 = vVar2;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&this->m_v,j);
      vVar2 = *pvVar5;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&__return_storage_ptr__->m_v,local_40);
      *pvVar4 = vVar2;
      local_40 = local_40 + 1;
      j = j + 1;
    }
    else {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&this->m_v,j);
      vVar2 = *pvVar5;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&B->m_v,k);
      if (vVar2 == *pvVar5) {
        j = j + 1;
      }
      k = k + 1;
    }
  }
  while (sVar3 = size(this), j < sVar3) {
    vVar2 = this->m_d[j];
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&__return_storage_ptr__->m_dlocal,local_40);
    *pvVar4 = vVar2;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&this->m_v,j);
    vVar2 = *pvVar5;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&__return_storage_ptr__->m_v,local_40);
    *pvVar4 = vVar2;
    local_40 = local_40 + 1;
    j = j + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&__return_storage_ptr__->m_v,local_40);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&__return_storage_ptr__->m_dlocal,local_40);
  return __return_storage_ptr__;
}

Assistant:

variable_set operator-(const variable_set& B) const {
		variable_set dest(size());
		size_t i, j, k;
		for (i = 0, j = 0, k = 0; i < size() && j < B.size();) {
			if (m_v[i] < B.m_v[j]) {
				dest.m_dlocal[k] = m_d[i];
				dest.m_v[k++] = m_v[i++];
			} else if (m_v[i] == B.m_v[j]) {
				i++;
				j++;
			} else {
				j++;
			}
		}
		while (i < size()) {
			dest.m_dlocal[k] = m_d[i];
			dest.m_v[k++] = m_v[i++];
		}
		dest.m_v.resize(k);
		dest.m_dlocal.resize(k);
		return dest;
	}